

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall
cfgfile::generator::cfg::tag_field_t::on_finish
          (tag_field_t *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  field_type_t fVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string_t local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  fVar2 = field_type_from_string
                    ((cfg *)(this->super_tag_no_value_t<cfgfile::string_trait_t>).
                            super_tag_t<cfgfile::string_trait_t>.m_name._M_dataplus._M_p,
                     (string *)
                     (this->super_tag_no_value_t<cfgfile::string_trait_t>).
                     super_tag_t<cfgfile::string_trait_t>.m_name._M_string_length);
  if ((fVar2 < custom_tag_field_type) && ((0x1aU >> (fVar2 & 0x1f) & 1) != 0)) {
    bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                      (&(this->m_value_type).super_tag_t<cfgfile::string_trait_t>);
    if (!bVar1) {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Undefined required tag \"","");
      std::operator+(&local_b0,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     c_value_type_tag_name_abi_cxx11_);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_110._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
        local_110.field_2._M_allocated_capacity = *psVar4;
        local_110.field_2._8_8_ = plVar3[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar4;
      }
      local_110._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::operator+(&local_90,&local_110,
                     &(this->super_tag_no_value_t<cfgfile::string_trait_t>).
                      super_tag_t<cfgfile::string_trait_t>.m_name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_130._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_130._M_dataplus._M_p == psVar4) {
        local_130.field_2._M_allocated_capacity = *psVar4;
        local_130.field_2._8_8_ = plVar3[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar4;
      }
      local_130._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_d0,info->m_line_number);
      std::operator+(&local_70,&local_130,&local_d0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_190._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_190._M_dataplus._M_p == psVar4) {
        local_190.field_2._M_allocated_capacity = *psVar4;
        local_190.field_2._8_8_ = plVar3[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar4;
      }
      local_190._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_f0,info->m_column_number);
      std::operator+(&local_50,&local_190,&local_f0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_170._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_170._M_dataplus._M_p == psVar4) {
        local_170.field_2._M_allocated_capacity = *psVar4;
        local_170.field_2._8_8_ = plVar3[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar4;
      }
      local_170._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_170);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  tag_no_value_t<cfgfile::string_trait_t>::on_finish
            (&this->super_tag_no_value_t<cfgfile::string_trait_t>,info);
  return;
}

Assistant:

void
tag_field_t::on_finish( const parser_info_t< cfgfile::string_trait_t > & info )
{
	switch( field_type_from_string( name() ) )
	{
		case field_t::scalar_field_type :
		case field_t::scalar_vector_field_type :
		case field_t::vector_of_tags_field_type :
		{
			if( !m_value_type.is_defined() )
				throw cfgfile::exception_t< cfgfile::string_trait_t >( std::string( "Undefined required "
						"tag \"" ) + c_value_type_tag_name +
					"\" in tag \"" + name() +
					"\". Line " + std::to_string( info.line_number() ) +
					", column " + std::to_string( info.column_number() ) + "." );
		}
			break;

		default :
			break;
	}

	cfgfile::tag_no_value_t<>::on_finish( info );
}